

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O0

void __thiscall
nuraft::raft_server::start_server(raft_server *this,bool skip_initial_election_timeout)

{
  bool bVar1;
  int iVar2;
  void *pvVar3;
  element_type *peVar4;
  element_type *peVar5;
  element_type *peVar6;
  timer_helper *this_00;
  element_type *peVar7;
  byte in_SIL;
  long in_RDI;
  nuraft_global_mgr *mgr;
  ptr<raft_params> params;
  undefined7 in_stack_fffffffffffffde8;
  undefined1 in_stack_fffffffffffffdef;
  EventAwaiter *in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  timer_helper *in_stack_fffffffffffffe00;
  context *in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  uint uVar8;
  uint in_stack_fffffffffffffe20;
  int in_stack_fffffffffffffe24;
  raft_server *in_stack_fffffffffffffe38;
  nuraft_global_mgr *in_stack_fffffffffffffe40;
  string local_170 [32];
  raft_server *in_stack_fffffffffffffeb0;
  string local_148 [32];
  string local_128 [32];
  string local_108 [40];
  code *local_e0;
  undefined8 local_d8;
  code *local_a8;
  undefined8 local_a0;
  string local_78 [32];
  string local_58 [48];
  nuraft_global_mgr *local_28;
  byte local_9;
  
  local_9 = in_SIL & 1;
  std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
            ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x21e7a7);
  nuraft::context::get_params(in_stack_fffffffffffffe08);
  local_28 = nuraft_global_mgr::get_instance();
  if (local_28 == (nuraft_global_mgr *)0x0) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
    if (bVar1) {
      peVar7 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x21e979);
      iVar2 = (*peVar7->_vptr_logger[7])();
      if (3 < iVar2) {
        peVar7 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x21e9b2);
        msg_if_given_abi_cxx11_
                  ((char *)local_78,
                   "global manager does not exist. will use local thread for commit and append");
        (*peVar7->_vptr_logger[8])
                  (peVar7,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                   ,"start_server",0x114,local_78);
        std::__cxx11::string::~string(local_78);
      }
    }
    local_a8 = commit_in_bg;
    local_a0 = 0;
    std::bind<void(nuraft::raft_server::*)(),nuraft::raft_server*>
              ((offset_in_raft_server_to_subr *)
               CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
               (raft_server **)in_stack_fffffffffffffdf0);
    std::thread::thread<std::_Bind<void(nuraft::raft_server::*(nuraft::raft_server*))()>,,void>
              ((thread *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
               (_Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*))()> *)
               CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    std::thread::operator=
              ((thread *)in_stack_fffffffffffffdf0,
               (thread *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
    std::thread::~thread((thread *)0x21eabe);
    pvVar3 = operator_new(0x60);
    EventAwaiter::EventAwaiter(in_stack_fffffffffffffdf0);
    *(void **)(in_RDI + 0x28) = pvVar3;
    local_e0 = append_entries_in_bg;
    local_d8 = 0;
    std::bind<void(nuraft::raft_server::*)(),nuraft::raft_server*>
              ((offset_in_raft_server_to_subr *)
               CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
               (raft_server **)in_stack_fffffffffffffdf0);
    std::thread::thread<std::_Bind<void(nuraft::raft_server::*(nuraft::raft_server*))()>,,void>
              ((thread *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
               (_Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*))()> *)
               CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    std::thread::operator=
              ((thread *)in_stack_fffffffffffffdf0,
               (thread *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
    std::thread::~thread((thread *)0x21eb6b);
  }
  else {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
    if (bVar1) {
      peVar7 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x21e816);
      iVar2 = (*peVar7->_vptr_logger[7])();
      if (3 < iVar2) {
        peVar7 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x21e84f);
        msg_if_given_abi_cxx11_
                  ((char *)local_58,"global manager is detected. will use shared thread pool");
        (*peVar7->_vptr_logger[8])
                  (peVar7,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                   ,"start_server",0x10d,local_58);
        std::__cxx11::string::~string(local_58);
      }
    }
    std::atomic<bool>::operator=
              ((atomic<bool> *)in_stack_fffffffffffffdf0,(bool)in_stack_fffffffffffffdef);
    std::atomic<bool>::operator=
              ((atomic<bool> *)in_stack_fffffffffffffdf0,(bool)in_stack_fffffffffffffdef);
    nuraft_global_mgr::init_raft_server(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  }
  if ((local_9 & 1) == 0) {
    std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x21ed06);
    bVar1 = srv_state::is_election_timer_allowed((srv_state *)0x21ed0e);
    if (bVar1) {
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
      if (bVar1) {
        peVar7 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x21ee3f);
        in_stack_fffffffffffffe24 = (*peVar7->_vptr_logger[7])();
        if (3 < in_stack_fffffffffffffe24) {
          peVar7 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x21ee72);
          peVar6 = std::
                   __shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x21ee89);
          uVar8 = peVar6->rpc_failure_backoff_;
          peVar6 = std::
                   __shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x21ee9a);
          in_stack_fffffffffffffe20 = peVar6->election_timeout_lower_bound_;
          peVar6 = std::
                   __shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x21eeab);
          msg_if_given_abi_cxx11_
                    ((char *)local_148,"wait for HB, for %d + [%d, %d] ms",(ulong)uVar8,
                     (ulong)in_stack_fffffffffffffe20,
                     (ulong)(uint)peVar6->election_timeout_upper_bound_);
          (*peVar7->_vptr_logger[8])
                    (peVar7,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                     ,"start_server",0x12f,local_148);
          std::__cxx11::string::~string(local_148);
        }
      }
      peVar6 = std::
               __shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x21ef41);
      std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                ((duration<long,std::ratio<1l,1000l>> *)&stack0xfffffffffffffeb0,
                 &peVar6->rpc_failure_backoff_);
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                ((duration<long,_std::ratio<1L,_1000L>_> *)
                 CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
      restart_election_timer(in_stack_fffffffffffffeb0);
    }
    else {
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
      if (bVar1) {
        peVar7 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x21ed53);
        iVar2 = (*peVar7->_vptr_logger[7])();
        if (3 < iVar2) {
          peVar7 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x21ed86);
          msg_if_given_abi_cxx11_
                    ((char *)local_128,
                     "skip initialization of election timer by previously saved state, waiting for the first heartbeat"
                    );
          (*peVar7->_vptr_logger[8])
                    (peVar7,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                     ,"start_server",0x129,local_128);
          std::__cxx11::string::~string(local_128);
        }
      }
    }
  }
  else {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
    if (bVar1) {
      peVar7 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x21ebcf);
      iVar2 = (*peVar7->_vptr_logger[7])();
      if (3 < iVar2) {
        peVar7 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x21ec02);
        msg_if_given_abi_cxx11_
                  ((char *)local_108,
                   "skip initialization of election timer by given parameter, waiting for the first heartbeat"
                  );
        (*peVar7->_vptr_logger[8])
                  (peVar7,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                   ,"start_server",0x121,local_108);
        std::__cxx11::string::~string(local_108);
      }
    }
    std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x21ec99);
    srv_state::allow_election_timer
              ((srv_state *)in_stack_fffffffffffffdf0,(bool)in_stack_fffffffffffffdef);
    std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
              ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x21ecb9);
    peVar4 = std::__shared_ptr_access<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x21ecc1);
    peVar5 = std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)in_stack_fffffffffffffdf0);
    (*peVar4->_vptr_state_mgr[4])(peVar4,peVar5);
  }
  timer_helper::reset(in_stack_fffffffffffffe00);
  this_00 = (timer_helper *)(in_RDI + 0x680);
  std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x21efac);
  timer_helper::set_duration_ms
            ((timer_helper *)in_stack_fffffffffffffdf0,
             CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
  timer_helper::reset(this_00);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
  if (bVar1) {
    peVar7 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x21f003);
    iVar2 = (*peVar7->_vptr_logger[7])();
    if (4 < iVar2) {
      peVar7 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x21f036);
      msg_if_given_abi_cxx11_((char *)local_170,"server %d started",(ulong)*(uint *)(in_RDI + 0x38))
      ;
      (*peVar7->_vptr_logger[8])
                (peVar7,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"start_server",0x137,local_170);
      std::__cxx11::string::~string(local_170);
    }
  }
  std::shared_ptr<nuraft::raft_params>::~shared_ptr((shared_ptr<nuraft::raft_params> *)0x21f0d1);
  return;
}

Assistant:

void raft_server::start_server(bool skip_initial_election_timeout)
{
    ptr<raft_params> params = ctx_->get_params();
    nuraft_global_mgr* mgr = nuraft_global_mgr::get_instance();
    if (mgr) {
        p_in("global manager is detected. will use shared thread pool");
        commit_bg_stopped_ = true;
        append_bg_stopped_ = true;
        mgr->init_raft_server(this);

    } else {
        p_in("global manager does not exist. "
             "will use local thread for commit and append");
        bg_commit_thread_ = std::thread(std::bind(&raft_server::commit_in_bg, this));

        bg_append_ea_ = new EventAwaiter();
        bg_append_thread_ = std::thread(std::bind(&raft_server::append_entries_in_bg, this));
    }

    if (skip_initial_election_timeout) {
        // Issue #23:
        //   During remediation, the node (to be added) shouldn't be
        //   even a temp leader (to avoid local commit). We provide
        //   this option for that purpose.
        p_in("skip initialization of election timer by given parameter, "
             "waiting for the first heartbeat");
        // Make this status persistent, so as to make it not
        // trigger any election even after process restart.
        state_->allow_election_timer(false);
        ctx_->state_mgr_->save_state(*state_);

    } else if (!state_->is_election_timer_allowed()) {
        p_in("skip initialization of election timer by previously saved state, "
             "waiting for the first heartbeat");

    } else {
        p_in("wait for HB, for %d + [%d, %d] ms",
             params->rpc_failure_backoff_,
             params->election_timeout_lower_bound_,
             params->election_timeout_upper_bound_);
        std::this_thread::sleep_for( std::chrono::milliseconds
                                     (params->rpc_failure_backoff_) );
        restart_election_timer();
    }
    priority_change_timer_.reset();
    vote_init_timer_.set_duration_ms(params->grace_period_of_lagging_state_machine_);
    vote_init_timer_.reset();
    p_db("server %d started", id_);
}